

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_topal.c
# Opt level: O3

void fill_inverse_cmap(gdImagePtr oim,gdImagePtr nim,my_cquantize_ptr cquantize,int c0,int c1,int c2
                      )

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int *piVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  byte *pbVar23;
  int iVar24;
  long lVar25;
  int iVar26;
  uint uVar27;
  byte *pbVar28;
  uint uVar29;
  int iVar30;
  bool bVar31;
  uchar colorlist [256];
  int mindist [256];
  byte local_5b8 [128];
  byte abStack_538 [256];
  int local_438 [2];
  undefined8 auStack_430 [128];
  
  uVar16 = (uint)cquantize * 8;
  uVar12 = uVar16 & 0xffffffe0;
  uVar1 = uVar12 + 4;
  uVar8 = c0 * 4 & 0xffffffe0;
  uVar2 = uVar8 + 2;
  uVar5 = c1 * 8 & 0xffffffe0;
  uVar3 = uVar5 + 4;
  lVar25 = (long)oim->colorsTotal;
  if (lVar25 < 1) {
    uVar5 = 0;
  }
  else {
    uVar16 = uVar16 | 0x1c;
    uVar27 = c0 * 4 | 0x1e;
    uVar29 = c1 * 8 | 0x1c;
    lVar18 = 0;
    iVar9 = 0x7fffffff;
    do {
      iVar10 = oim->red[lVar18];
      uVar6 = uVar16;
      if (iVar10 < (int)uVar1) {
        iVar13 = (iVar10 - uVar1) * 2;
        iVar13 = iVar13 * iVar13;
      }
      else if (iVar10 - uVar16 == 0 || iVar10 < (int)uVar16) {
        if ((int)(uVar12 + uVar16 + 4) >> 1 < iVar10) {
          uVar6 = uVar1;
        }
        iVar13 = 0;
      }
      else {
        iVar13 = (iVar10 - uVar16) * 2;
        iVar13 = iVar13 * iVar13;
        uVar6 = uVar1;
      }
      iVar14 = oim->green[lVar18];
      uVar19 = uVar27;
      if (iVar14 < (int)uVar2) {
        iVar24 = (iVar14 - uVar2) * 3;
        iVar13 = iVar13 + iVar24 * iVar24;
      }
      else if (iVar14 - uVar27 == 0 || iVar14 < (int)uVar27) {
        if ((int)(uVar8 + uVar27 + 2) >> 1 < iVar14) {
          uVar19 = uVar2;
        }
      }
      else {
        iVar24 = (iVar14 - uVar27) * 3;
        iVar13 = iVar13 + iVar24 * iVar24;
        uVar19 = uVar2;
      }
      iVar24 = oim->blue[lVar18];
      uVar21 = uVar29;
      if (iVar24 < (int)uVar3) {
        iVar13 = iVar13 + (iVar24 - uVar3) * (iVar24 - uVar3);
      }
      else {
        iVar30 = iVar24 - uVar29;
        if (iVar30 == 0 || iVar24 < (int)uVar29) {
          if ((int)(uVar5 + uVar29 + 4) >> 1 < iVar24) {
            uVar21 = uVar3;
          }
        }
        else {
          iVar13 = iVar13 + iVar30 * iVar30;
          uVar21 = uVar3;
        }
      }
      iVar30 = (iVar10 - uVar6) * 2;
      iVar10 = (iVar14 - uVar19) * 3;
      iVar10 = (iVar24 - uVar21) * (iVar24 - uVar21) + iVar10 * iVar10 + iVar30 * iVar30;
      *(int *)((long)auStack_430 + lVar18 * 4 + -8) = iVar13;
      if (iVar9 <= iVar10) {
        iVar10 = iVar9;
      }
      lVar18 = lVar18 + 1;
      iVar9 = iVar10;
    } while (lVar25 != lVar18);
    lVar18 = 0;
    uVar5 = 0;
    do {
      if (*(int *)((long)auStack_430 + lVar18 * 4 + -8) <= iVar10) {
        lVar20 = (long)(int)uVar5;
        uVar5 = uVar5 + 1;
        abStack_538[lVar20] = (byte)lVar18;
      }
      lVar18 = lVar18 + 1;
    } while (lVar25 != lVar18);
  }
  lVar25 = 0;
  do {
    *(undefined8 *)((long)auStack_430 + lVar25 * 4 + -8) = 0x7fffffff7fffffff;
    *(undefined8 *)((long)auStack_430 + lVar25 * 4) = 0x7fffffff7fffffff;
    lVar25 = lVar25 + 4;
  } while (lVar25 != 0x80);
  if (0 < (int)uVar5) {
    uVar7 = 0;
    do {
      bVar4 = abStack_538[uVar7];
      iVar9 = oim->blue[bVar4];
      iVar30 = uVar1 - oim->red[bVar4];
      iVar13 = iVar30 * 2;
      iVar14 = uVar2 - oim->green[bVar4];
      iVar10 = iVar14 * 3;
      iVar24 = uVar3 - iVar9;
      iVar13 = iVar24 * iVar24 + iVar10 * iVar10 + iVar13 * iVar13;
      iVar24 = iVar30 * 0x40 + 0x100;
      iVar10 = 3;
      pbVar28 = local_5b8;
      piVar15 = local_438;
      do {
        iVar11 = 7;
        iVar26 = iVar14 * 0x48 + 0x90;
        iVar30 = iVar13;
        do {
          iVar22 = 0;
          iVar17 = iVar30;
          do {
            if (iVar17 < *piVar15) {
              *piVar15 = iVar17;
              *pbVar28 = bVar4;
            }
            iVar17 = iVar17 + ((c1 & 0xfffffffcU) << 7 | 0x80) + iVar9 * -0x10 + iVar22;
            piVar15 = piVar15 + 1;
            pbVar28 = pbVar28 + 1;
            iVar22 = iVar22 + 0x80;
          } while (iVar22 != 0x200);
          iVar30 = iVar30 + iVar26;
          iVar26 = iVar26 + 0x120;
          bVar31 = iVar11 != 0;
          iVar11 = iVar11 + -1;
        } while (bVar31);
        iVar13 = iVar13 + iVar24;
        iVar24 = iVar24 + 0x200;
        bVar31 = iVar10 != 0;
        iVar10 = iVar10 + -1;
      } while (bVar31);
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar5);
  }
  pbVar28 = local_5b8;
  uVar7 = 0;
  do {
    lVar25 = *(long *)(nim->red + (uVar7 | (long)(int)((uint)cquantize & 0xfffffffc)) * 2 + -5) +
             (long)(int)(c0 & 0xfffffff8) * 0x40 + (long)(int)(c1 & 0xfffffffc) * 2;
    lVar18 = 0;
    do {
      pbVar23 = pbVar28;
      lVar20 = 0;
      do {
        *(ushort *)(lVar25 + lVar20 * 2) = pbVar23[lVar20] + 1;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 4);
      lVar18 = lVar18 + 1;
      lVar25 = lVar25 + 0x40;
      pbVar28 = pbVar23 + 4;
    } while (lVar18 != 8);
    uVar7 = uVar7 + 1;
    pbVar28 = pbVar23 + 4;
  } while (uVar7 != 4);
  return;
}

Assistant:

LOCAL (void)
fill_inverse_cmap (
    gdImagePtr oim, gdImagePtr nim, my_cquantize_ptr cquantize,
    int c0, int c1, int c2)
/* Fill the inverse-colormap entries in the update box that contains */
/* histogram cell c0/c1/c2.  (Only that one cell MUST be filled, but */
/* we can fill as many others as we wish.) */
{
	hist3d histogram = cquantize->histogram;
	int minc0, minc1, minc2;	/* lower left corner of update box */
	int ic0, ic1, ic2;
	register JSAMPLE *cptr;	/* pointer into bestcolor[] array */
	register histptr cachep;	/* pointer into main cache array */
	/* This array lists the candidate colormap indexes. */
	JSAMPLE colorlist[MAXNUMCOLORS];
	int numcolors;		/* number of candidate colors */
	/* This array holds the actually closest colormap index for each cell. */
	JSAMPLE bestcolor[BOX_C0_ELEMS * BOX_C1_ELEMS * BOX_C2_ELEMS];

	/* Convert cell coordinates to update box ID */
	c0 >>= BOX_C0_LOG;
	c1 >>= BOX_C1_LOG;
	c2 >>= BOX_C2_LOG;

	/* Compute true coordinates of update box's origin corner.
	 * Actually we compute the coordinates of the center of the corner
	 * histogram cell, which are the lower bounds of the volume we care about.
	 */
	minc0 = (c0 << BOX_C0_SHIFT) + ((1 << C0_SHIFT) >> 1);
	minc1 = (c1 << BOX_C1_SHIFT) + ((1 << C1_SHIFT) >> 1);
	minc2 = (c2 << BOX_C2_SHIFT) + ((1 << C2_SHIFT) >> 1);

	/* Determine which colormap entries are close enough to be candidates
	 * for the nearest entry to some cell in the update box.
	 */
	numcolors =
	    find_nearby_colors (oim, nim, cquantize, minc0, minc1, minc2, colorlist);
	find_best_colors (oim, nim, cquantize, minc0, minc1, minc2, numcolors,
			  colorlist, bestcolor);

	/* Save the best color numbers (plus 1) in the main cache array */
	c0 <<= BOX_C0_LOG;		/* convert ID back to base cell indexes */
	c1 <<= BOX_C1_LOG;
	c2 <<= BOX_C2_LOG;
	cptr = bestcolor;
	for (ic0 = 0; ic0 < BOX_C0_ELEMS; ic0++) {
		for (ic1 = 0; ic1 < BOX_C1_ELEMS; ic1++) {
			cachep = &histogram[c0 + ic0][c1 + ic1][c2];
			for (ic2 = 0; ic2 < BOX_C2_ELEMS; ic2++) {
				*cachep++ = (histcell) ((*cptr++) + 1);
			}
		}
	}
}